

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

int mbedtls_mpi_write_string(mbedtls_mpi *X,int radix,char *buf,size_t buflen,size_t *olen)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  char *pcVar4;
  size_t k;
  size_t j;
  size_t i;
  undefined1 local_68 [4];
  int c;
  mbedtls_mpi T;
  char *p;
  size_t n;
  int ret;
  size_t *olen_local;
  size_t buflen_local;
  char *buf_local;
  int radix_local;
  mbedtls_mpi *X_local;
  
  n._4_4_ = 0;
  if ((radix < 2) || (0x10 < radix)) {
    return -4;
  }
  p = (char *)mbedtls_mpi_bitlen(X);
  if (3 < radix) {
    p = (char *)((ulong)p >> 1);
  }
  if (0xf < radix) {
    p = (char *)((ulong)p >> 1);
  }
  if (buflen < p + ((ulong)(p + 1) & 1) + 3) {
    *olen = (size_t)(p + ((ulong)(p + 1) & 1) + 3);
    return -8;
  }
  T.p = (mbedtls_mpi_uint *)buf;
  mbedtls_mpi_init((mbedtls_mpi *)local_68);
  if (X->s == -1) {
    *(undefined1 *)T.p = 0x2d;
    T.p = (mbedtls_mpi_uint *)((long)T.p + 1);
  }
  if (radix == 0x10) {
    bVar1 = false;
    for (j = X->n; j != 0; j = j - 1) {
      for (k = 8; k != 0; k = k - 1) {
        uVar3 = X->p[j - 1] >> (((char)k + -1) * '\b' & 0x3fU);
        uVar2 = (uint)uVar3 & 0xff;
        if ((((uVar3 & 0xff) != 0) || (bVar1)) || (j + k == 2)) {
          pcVar4 = (char *)((long)T.p + 1);
          *(char *)T.p = "0123456789ABCDEF"[(int)(uVar2 / 0x10)];
          T.p = (mbedtls_mpi_uint *)((long)T.p + 2);
          *pcVar4 = "0123456789ABCDEF"[(int)(uVar2 % 0x10)];
          bVar1 = true;
        }
      }
    }
  }
  else {
    n._4_4_ = mbedtls_mpi_copy((mbedtls_mpi *)local_68,X);
    if (n._4_4_ != 0) goto LAB_0011e4a2;
    if (local_68 == (undefined1  [4])0xffffffff) {
      local_68 = (undefined1  [4])0x1;
    }
    n._4_4_ = mpi_write_hlp((mbedtls_mpi *)local_68,radix,(char **)&T.p);
    if (n._4_4_ != 0) goto LAB_0011e4a2;
  }
  *(undefined1 *)T.p = 0;
  *olen = ((long)T.p + 1) - (long)buf;
  T.p = (mbedtls_mpi_uint *)((long)T.p + 1);
LAB_0011e4a2:
  mbedtls_mpi_free((mbedtls_mpi *)local_68);
  return n._4_4_;
}

Assistant:

int mbedtls_mpi_write_string( const mbedtls_mpi *X, int radix,
                              char *buf, size_t buflen, size_t *olen )
{
    int ret = 0;
    size_t n;
    char *p;
    mbedtls_mpi T;

    if( radix < 2 || radix > 16 )
        return( MBEDTLS_ERR_MPI_BAD_INPUT_DATA );

    n = mbedtls_mpi_bitlen( X );
    if( radix >=  4 ) n >>= 1;
    if( radix >= 16 ) n >>= 1;
    /*
     * Round up the buffer length to an even value to ensure that there is
     * enough room for hexadecimal values that can be represented in an odd
     * number of digits.
     */
    n += 3 + ( ( n + 1 ) & 1 );

    if( buflen < n )
    {
        *olen = n;
        return( MBEDTLS_ERR_MPI_BUFFER_TOO_SMALL );
    }

    p = buf;
    mbedtls_mpi_init( &T );

    if( X->s == -1 )
        *p++ = '-';

    if( radix == 16 )
    {
        int c;
        size_t i, j, k;

        for( i = X->n, k = 0; i > 0; i-- )
        {
            for( j = ciL; j > 0; j-- )
            {
                c = ( X->p[i - 1] >> ( ( j - 1 ) << 3) ) & 0xFF;

                if( c == 0 && k == 0 && ( i + j ) != 2 )
                    continue;

                *(p++) = "0123456789ABCDEF" [c / 16];
                *(p++) = "0123456789ABCDEF" [c % 16];
                k = 1;
            }
        }
    }
    else
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &T, X ) );

        if( T.s == -1 )
            T.s = 1;

        MBEDTLS_MPI_CHK( mpi_write_hlp( &T, radix, &p ) );
    }

    *p++ = '\0';
    *olen = p - buf;

cleanup:

    mbedtls_mpi_free( &T );

    return( ret );
}